

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security-bootstrapping.c
# Opt level: O3

void on_sign_on_data(uint8_t *raw_data,uint32_t data_size,void *userdata)

{
  uint8_t *data_00;
  ndn_name_t *name;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  ndn_ecc_prv_t *ecc_prv;
  ndn_aes_key_t *aes_key;
  uint32_t uVar5;
  uint uVar6;
  uint32_t datalen;
  uint uVar7;
  bool bVar8;
  undefined1 local_13e8 [8];
  ndn_data_t trust_anchor_cert;
  ndn_name_t prefix_to_register;
  ndn_data_t data;
  uint8_t dh_pub_buf [100];
  undefined1 local_98 [8];
  ndn_encoder_t encoder;
  uint8_t shared [32];
  uint8_t symmetric_key [16];
  uint8_t salt [16];
  ndn_decoder_t local_40;
  
  iVar4 = ndn_data_tlv_decode_hmac_verify
                    ((ndn_data_t *)&prefix_to_register.components[9].size,raw_data,data_size,
                     m_sec_boot_state.pre_shared_hmac_key);
  if (iVar4 != 0) {
    printf("ERROR: %s, L%d: ","on_sign_on_data",0x132);
    printf("[BOOTSTRAPPING] Decoding failed.");
    return;
  }
  printf("DEBUG: %s, L%d: ","on_sign_on_data",0x135);
  printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-PKT-SIZE: %u Bytes\n",data_size);
  printf("INFO: %s: ","on_sign_on_data");
  printf("[BOOTSTRAPPING] Receive Sign On Data packet with name");
  putchar(10);
  ndn_name_print((ndn_name_t *)&prefix_to_register.components[9].size);
  data_00 = &data.metainfo.final_block_id.size;
  local_40.input_value = data_00;
  local_40.input_size._0_1_ = data.content_value[0x3f8];
  local_40.input_size._1_1_ = data.content_value[0x3f9];
  local_40.input_size._2_1_ = data.content_value[0x3fa];
  local_40.input_size._3_1_ = data.content_value[0x3fb];
  uVar7 = (uint)data.metainfo.final_block_id.size;
  if (data.metainfo.final_block_id.size < 0xfd) {
    uVar6 = 1;
  }
  else if ((uint)data.content_value._1016_4_ < 3 || data.metainfo.final_block_id.size != 0xfd) {
    if ((uint)data.content_value._1016_4_ < 5 || data.metainfo.final_block_id.size != 0xfe) {
      return;
    }
    uVar7 = (uint)data.metainfo._49_4_ >> 0x18 | (data.metainfo._49_4_ & 0xff0000) >> 8 |
            (data.metainfo._49_4_ & 0xff00) << 8 | data.metainfo._49_4_ << 0x18;
    uVar6 = 5;
  }
  else {
    uVar7 = (uint)(ushort)(data.metainfo.final_block_id._41_2_ << 8 |
                          (ushort)data.metainfo.final_block_id._41_2_ >> 8);
    uVar6 = 3;
  }
  if (uVar7 != 6) {
    return;
  }
  bVar1 = data.metainfo.final_block_id.value[(ulong)uVar6 + 0x24];
  uVar7 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar4 = 1;
LAB_00104fba:
    local_40.offset = iVar4 + uVar6 + uVar7;
    iVar4 = 1;
    if (0xfc < uVar7) {
      iVar4 = (0xffff < uVar7) + 3 + (uint)(0xffff < uVar7);
    }
  }
  else {
    if (2 < data.content_value._1016_4_ - uVar6 && bVar1 == 0xfd) {
      uVar2 = *(ushort *)(data.metainfo.final_block_id.value + (ulong)uVar6 + 0x25);
      uVar7 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
      iVar4 = 3;
      goto LAB_00104fba;
    }
    if (bVar1 == 0xfe && 4 < data.content_value._1016_4_ - uVar6) {
      uVar7 = *(uint *)(data.metainfo.final_block_id.value + (ulong)uVar6 + 0x25);
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      iVar4 = 5;
      goto LAB_00104fba;
    }
    local_40.offset = uVar6 + 6;
    iVar4 = 1;
    uVar7 = 6;
  }
  uVar5 = local_40.offset;
  datalen = iVar4 + uVar7 + 1;
  ndn_sha256(data_00,datalen,m_sec_boot_state.trust_anchor_sha);
  iVar4 = ndn_data_tlv_decode_no_verify
                    ((ndn_data_t *)local_13e8,data_00,datalen,(uint32_t *)0x0,(uint32_t *)0x0);
  if (iVar4 != 0) {
    return;
  }
  ndn_key_storage_set_trust_anchor((ndn_data_t *)local_13e8);
  bVar1 = data.metainfo.final_block_id.value[(ulong)uVar5 + 0x24];
  if (bVar1 < 0xfd) {
    iVar4 = 1;
    uVar7 = (uint)bVar1;
LAB_001050e8:
    uVar5 = uVar5 + iVar4;
    local_40.offset = uVar5;
  }
  else {
    if ((bVar1 == 0xfd) && (2 < data.content_value._1016_4_ - uVar5)) {
      uVar7 = (uint)CONCAT11(data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24],
                             data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24]);
      iVar4 = 3;
      goto LAB_001050e8;
    }
    if ((bVar1 == 0xfe) && (4 < data.content_value._1016_4_ - uVar5)) {
      uVar7 = (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 4) + 0x24] |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 3) + 0x24] << 8 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24] << 0x10 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24] << 0x18;
      iVar4 = 5;
      goto LAB_001050e8;
    }
  }
  if (uVar7 != 0xa3) {
    return;
  }
  bVar1 = data.metainfo.final_block_id.value[(ulong)uVar5 + 0x24];
  uVar7 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar4 = 1;
LAB_001051ba:
    uVar5 = uVar5 + iVar4;
    uVar6 = data.content_value._1016_4_ - uVar5;
    local_40.offset = uVar5;
  }
  else {
    uVar6 = data.content_value._1016_4_ - uVar5;
    if ((bVar1 == 0xfd) && (2 < uVar6)) {
      uVar7 = (uint)CONCAT11(data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24],
                             data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24]);
      iVar4 = 3;
      goto LAB_001051ba;
    }
    bVar8 = uVar7 == 0xfe;
    uVar7 = 0xa3;
    if ((bVar8) && (4 < uVar6)) {
      uVar7 = (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 4) + 0x24] |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 3) + 0x24] << 8 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24] << 0x10 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24] << 0x18;
      iVar4 = 5;
      goto LAB_001051ba;
    }
  }
  if ((int)uVar7 <= (int)uVar6) {
    memcpy(data.signature.validity_period.not_after + 9,data_00 + uVar5,(ulong)uVar7);
    uVar5 = uVar5 + uVar7;
    uVar6 = data.content_value._1016_4_ - uVar5;
    local_40.offset = uVar5;
  }
  iVar4 = 1;
  ndn_ecc_pub_init(&m_sec_boot_state.controller_dh_pub,data.signature.validity_period.not_after + 9,
                   uVar7,' ',1);
  ecc_prv = ndn_key_storage_get_ecc_prv_key(0x2712);
  m_measure_tp1 = ndn_time_now_us();
  ndn_ecc_dh_shared_secret
            (&m_sec_boot_state.controller_dh_pub,ecc_prv,(uint8_t *)&encoder.output_max_size,0x20);
  m_measure_tp2 = ndn_time_now_us();
  printf("DEBUG: %s, L%d: ","on_sign_on_data",0x15f);
  printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-ECDH: %lu\n",m_measure_tp2 - m_measure_tp1);
  bVar1 = data.metainfo.final_block_id.value[(ulong)uVar5 + 0x24];
  uVar3 = (uint)bVar1;
  if (0xfc < bVar1) {
    if ((bVar1 == 0xfd) && (2 < uVar6)) {
      iVar4 = 3;
      uVar3 = (uint)CONCAT11(data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24],
                             data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24]);
    }
    else {
      if ((bVar1 != 0xfe) || (uVar6 < 5)) goto LAB_00105331;
      iVar4 = 5;
      uVar3 = (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 4) + 0x24] |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 3) + 0x24] << 8 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 2) + 0x24] << 0x10 |
              (uint)data.metainfo.final_block_id.value[(ulong)(uVar5 + 1) + 0x24] << 0x18;
    }
  }
  uVar7 = uVar3;
  local_40.offset = iVar4 + uVar5;
LAB_00105331:
  if (uVar7 == 0x83) {
    decoder_get_length(&local_40,(uint32_t *)(salt + 0xc));
    if (0xf < (int)(local_40.input_size - local_40.offset)) {
      symmetric_key._8_8_ = *(undefined8 *)(local_40.input_value + local_40.offset);
      salt._0_8_ = *(undefined8 *)(local_40.input_value + local_40.offset + 8);
    }
    m_measure_tp1 = ndn_time_now_us();
    aes_key = ndn_key_storage_get_empty_aes_key();
    ndn_hkdf((uint8_t *)&encoder.output_max_size,0x20,shared + 0x18,0x10,symmetric_key + 8,0x10,
             (uint8_t *)0x0,0);
    ndn_aes_load_key(aes_key,shared + 0x18,0x10);
    aes_key->key_id = 0x2713;
    m_measure_tp2 = ndn_time_now_us();
    printf("DEBUG: %s, L%d: ","on_sign_on_data",0x176);
    printf("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-HKDF: %lu\n",m_measure_tp2 - m_measure_tp1);
    name = (ndn_name_t *)(trust_anchor_cert.signature.validity_period.not_after + 0xd);
    ndn_name_init(name);
    ndn_name_append_component(name,(name_component_t *)local_13e8);
    memset(sec_boot_buf,0,0x1000);
    local_98 = (undefined1  [8])sec_boot_buf;
    encoder.output_value = (uint8_t *)0x1000;
    ndn_name_tlv_encode((ndn_encoder_t *)local_98,name);
    ndn_forwarder_add_route
              (m_sec_boot_state.face,(uint8_t *)local_98,(ulong)encoder.output_value >> 0x20);
    ndn_time_delay(0x3c);
    sec_boot_send_cert_interest();
  }
  return;
}

Assistant:

void
on_sign_on_data(const uint8_t* raw_data, uint32_t data_size, void* userdata)
{
  // parse received data
  ndn_data_t data;
  if (ndn_data_tlv_decode_hmac_verify(&data, raw_data, data_size, m_sec_boot_state.pre_shared_hmac_key) != NDN_SUCCESS) {
    NDN_LOG_ERROR("[BOOTSTRAPPING] Decoding failed.");
    return;
  }
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-PKT-SIZE: %u Bytes\n", data_size);
  NDN_LOG_INFO("[BOOTSTRAPPING] Receive Sign On Data packet with name");
  NDN_LOG_INFO_NAME(&data.name);
  uint32_t probe = 0;

  // parse content
  // format: a data packet, ecdh pub, salt
  ndn_decoder_t decoder;
  decoder_init(&decoder, data.content_value, data.content_size);
  // trust anchor certificate
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_Data) return;
  decoder_get_length(&decoder, &probe);
  decoder.offset += probe;
  // calculate the sha256 digest of the trust anchor
  ndn_sha256(decoder.input_value, encoder_probe_block_size(TLV_Data, probe),
             m_sec_boot_state.trust_anchor_sha);
  ndn_data_t trust_anchor_cert;
  if (ndn_data_tlv_decode_no_verify(&trust_anchor_cert, data.content_value, encoder_probe_block_size(TLV_Data, probe), NULL, NULL) != NDN_SUCCESS) {
    return;
  }
  // key storage set trust anchor
  ndn_key_storage_set_trust_anchor(&trust_anchor_cert);
  // parse ecdh pub key, N2
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_SEC_BOOT_N2_ECDH_PUB) return;
  decoder_get_length(&decoder, &probe);
  uint8_t dh_pub_buf[100];
  decoder_get_raw_buffer_value(&decoder, dh_pub_buf, probe);
  ndn_ecc_pub_init(&m_sec_boot_state.controller_dh_pub, dh_pub_buf, probe, NDN_ECDSA_CURVE_SECP256R1, 1);
  ndn_ecc_prv_t* self_prv_key = ndn_key_storage_get_ecc_prv_key(SEC_BOOT_DH_KEY_ID);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // get shared secret using DH process
  uint8_t shared[32];
  ndn_ecc_dh_shared_secret(&m_sec_boot_state.controller_dh_pub, self_prv_key, shared, sizeof(shared));

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-ECDH: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  // decode salt from the replied data
  decoder_get_type(&decoder, &probe);
  if (probe != TLV_AC_SALT) return;
  decoder_get_length(&decoder, &probe);
  uint8_t salt[NDN_APPSUPPORT_AC_SALT_SIZE];
  decoder_get_raw_buffer_value(&decoder, salt, sizeof(salt));

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // generate AES key using HKDF
  ndn_aes_key_t* sym_aes_key = ndn_key_storage_get_empty_aes_key();
  uint8_t symmetric_key[NDN_APPSUPPORT_AC_EDK_SIZE];
  ndn_hkdf(shared, sizeof(shared), symmetric_key, sizeof(symmetric_key),
           salt, sizeof(salt), NULL, 0);
  ndn_aes_key_init(sym_aes_key, symmetric_key, sizeof(symmetric_key), SEC_BOOT_AES_KEY_ID);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-DATA1-HKDF: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  // prepare for the next interest: register the prefix
  ndn_name_t prefix_to_register;
  ndn_name_init(&prefix_to_register);
  ndn_name_append_component(&prefix_to_register, &trust_anchor_cert.name.components[0]);
  ndn_encoder_t encoder;
  encoder_init(&encoder, sec_boot_buf, sizeof(sec_boot_buf));
  ndn_name_tlv_encode(&encoder, &prefix_to_register);
  ndn_forwarder_add_route(m_sec_boot_state.face, encoder.output_value, encoder.offset);
  // send cert interest
  ndn_time_delay(60);
  sec_boot_send_cert_interest();
}